

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_count_shift.hpp
# Opt level: O2

result_type __thiscall trng::lcg64_count_shift::operator()(lcg64_count_shift *this)

{
  ulong uVar1;
  
  step(this);
  uVar1 = (this->S).count + (this->S).r;
  uVar1 = uVar1 >> 0x11 ^ uVar1;
  uVar1 = uVar1 << 0x1f ^ uVar1;
  return uVar1 >> 8 ^ uVar1;
}

Assistant:

TRNG_CUDA_ENABLE
  inline lcg64_count_shift::result_type lcg64_count_shift::operator()() {
    step();
    result_type t{S.r + S.count};
    t ^= (t >> 17u);
    t ^= (t << 31u);
    t ^= (t >> 8u);
    return t;
  }